

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

void __thiscall llvm::Twine::printOneChild(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  NodeKind Kind_local;
  raw_ostream *OS_local;
  Twine *this_local;
  Child Ptr_local;
  
  this_local._0_4_ = Ptr.decUI;
  switch(Kind) {
  case NullKind:
    break;
  case EmptyKind:
    break;
  case TwineKind:
    print(Ptr.twine,OS);
    break;
  case CStringKind:
    raw_ostream::operator<<(OS,Ptr.cString);
    break;
  case StdStringKind:
    raw_ostream::operator<<(OS,Ptr.stdString);
    break;
  case StringRefKind:
    raw_ostream::operator<<(OS,*Ptr.stringRef);
    break;
  case SmallStringKind:
    raw_ostream::operator<<(OS,Ptr.smallString);
    break;
  case FormatvObjectKind:
    raw_ostream::operator<<(OS,Ptr.formatvObject);
    break;
  case CharKind:
    this_local._0_1_ = Ptr.character;
    raw_ostream::operator<<(OS,(char)this_local);
    break;
  case DecUIKind:
    raw_ostream::operator<<(OS,(uint)this_local);
    break;
  case DecIKind:
    raw_ostream::operator<<(OS,(uint)this_local);
    break;
  case DecULKind:
    raw_ostream::operator<<(OS,*Ptr.decUL);
    break;
  case DecLKind:
    raw_ostream::operator<<(OS,*Ptr.decL);
    break;
  case DecULLKind:
    raw_ostream::operator<<(OS,*Ptr.decULL);
    break;
  case DecLLKind:
    raw_ostream::operator<<(OS,*Ptr.decLL);
    break;
  case UHexKind:
    raw_ostream::write_hex(OS,*Ptr.decULL);
  }
  return;
}

Assistant:

void Twine::printOneChild(raw_ostream &OS, Child Ptr,
                          NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind: break;
  case Twine::EmptyKind: break;
  case Twine::TwineKind:
    Ptr.twine->print(OS);
    break;
  case Twine::CStringKind:
    OS << Ptr.cString;
    break;
  case Twine::StdStringKind:
    OS << *Ptr.stdString;
    break;
  case Twine::StringRefKind:
    OS << *Ptr.stringRef;
    break;
  case Twine::SmallStringKind:
    OS << *Ptr.smallString;
    break;
  case Twine::FormatvObjectKind:
    OS << *Ptr.formatvObject;
    break;
  case Twine::CharKind:
    OS << Ptr.character;
    break;
  case Twine::DecUIKind:
    OS << Ptr.decUI;
    break;
  case Twine::DecIKind:
    OS << Ptr.decI;
    break;
  case Twine::DecULKind:
    OS << *Ptr.decUL;
    break;
  case Twine::DecLKind:
    OS << *Ptr.decL;
    break;
  case Twine::DecULLKind:
    OS << *Ptr.decULL;
    break;
  case Twine::DecLLKind:
    OS << *Ptr.decLL;
    break;
  case Twine::UHexKind:
    OS.write_hex(*Ptr.uHex);
    break;
  }
}